

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

unsigned_long_long ZSTD_getFrameContentSize(void *src,size_t srcSize)

{
  size_t sVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader local_38;
  
  sVar1 = ZSTD_getFrameHeader_advanced(&local_38,src,srcSize,ZSTD_f_zstd1);
  uVar3 = 0;
  if (local_38.frameType != ZSTD_skippableFrame) {
    uVar3 = local_38.frameContentSize;
  }
  uVar2 = 0xfffffffffffffffe;
  if (sVar1 == 0) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

unsigned long long ZSTD_getFrameContentSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize)) {
        unsigned long long const ret = ZSTD_getDecompressedSize_legacy(src, srcSize);
        return ret == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : ret;
    }
#endif
    {   ZSTD_frameHeader zfh;
        if (ZSTD_getFrameHeader(&zfh, src, srcSize) != 0)
            return ZSTD_CONTENTSIZE_ERROR;
        if (zfh.frameType == ZSTD_skippableFrame) {
            return 0;
        } else {
            return zfh.frameContentSize;
    }   }
}